

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall QGraphicsAnchorLayoutPrivate::deleteLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsAnchorLayoutPrivate *this_00;
  AnchorVertex *v1;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  AnchorPoint in_stack_0000000c;
  QGraphicsAnchorLayout *q;
  AnchorVertex *in_stack_ffffffffffffffe8;
  QGraphicsAnchorLayoutPrivate *this_01;
  
  this_01 = in_RDI;
  this_00 = (QGraphicsAnchorLayoutPrivate *)q_func(in_RDI);
  internalVertex(this_01,(QGraphicsLayoutItem *)this_00,in_stack_0000000c);
  internalVertex(this_01,(QGraphicsLayoutItem *)this_00,in_stack_0000000c);
  removeAnchor_helper(this_00,in_stack_ffffffffffffffe8,(AnchorVertex *)in_RDI);
  v1 = internalVertex(this_01,(QGraphicsLayoutItem *)this_00,in_stack_0000000c);
  internalVertex(this_01,(QGraphicsLayoutItem *)this_00,in_stack_0000000c);
  removeAnchor_helper(this_00,v1,(AnchorVertex *)in_RDI);
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::deleteLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);

    Q_ASSERT(!internalVertex(q, Qt::AnchorHorizontalCenter));
    Q_ASSERT(!internalVertex(q, Qt::AnchorVerticalCenter));

    removeAnchor_helper(internalVertex(q, Qt::AnchorLeft),
                        internalVertex(q, Qt::AnchorRight));
    removeAnchor_helper(internalVertex(q, Qt::AnchorTop),
                        internalVertex(q, Qt::AnchorBottom));
}